

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

TStatus luaD_pcall(lua_State *L,Pfunc func,void *u,ptrdiff_t old_top,ptrdiff_t ef)

{
  lu_byte lVar1;
  CallInfo *pCVar2;
  ptrdiff_t pVar3;
  TString *pTVar4;
  long lVar5;
  TStatus status;
  byte bVar6;
  TValue *io;
  long *plVar7;
  
  pCVar2 = L->ci;
  lVar1 = L->allowhook;
  pVar3 = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L,func,u);
  if (status != '\0') {
    L->ci = pCVar2;
    L->allowhook = lVar1;
    status = luaD_closeprotected(L,old_top,status);
    plVar7 = (long *)(old_top + (long)(L->stack).p);
    if (status == '\x04') {
      pTVar4 = L->l_G->memerrmsg;
      *plVar7 = (long)pTVar4;
      bVar6 = pTVar4->tt | 0x40;
    }
    else {
      lVar5 = (L->top).offset;
      *plVar7 = *(long *)(lVar5 + -0x10);
      bVar6 = *(byte *)(lVar5 + -8);
    }
    *(byte *)(plVar7 + 1) = bVar6;
    (L->top).p = (StkId)(plVar7 + 2);
    luaD_shrinkstack(L);
  }
  L->errfunc = pVar3;
  return status;
}

Assistant:

TStatus luaD_pcall (lua_State *L, Pfunc func, void *u, ptrdiff_t old_top,
                                  ptrdiff_t ef) {
  TStatus status;
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  ptrdiff_t old_errfunc = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L, func, u);
  if (l_unlikely(status != LUA_OK)) {  /* an error occurred? */
    L->ci = old_ci;
    L->allowhook = old_allowhooks;
    status = luaD_closeprotected(L, old_top, status);
    luaD_seterrorobj(L, status, restorestack(L, old_top));
    luaD_shrinkstack(L);   /* restore stack size in case of overflow */
  }
  L->errfunc = old_errfunc;
  return status;
}